

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap_base.h
# Opt level: O3

void phmap::priv::
     Deallocate<8ul,phmap::priv::Alloc<std::pair<phmap::priv::NonStandardLayout_const,int>>>
               (Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_> *alloc,void *p,size_t n
               )

{
  if (n != 0) {
    operator_delete(p,n + 7 & 0xfffffffffffffff8);
    return;
  }
  __assert_fail("n && \"n must be positive\"",
                "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap_base.h"
                ,0x106f,
                "void phmap::priv::Deallocate(Alloc *, void *, size_t) [Alignment = 8UL, Alloc = phmap::priv::Alloc<std::pair<const phmap::priv::NonStandardLayout, int>>]"
               );
}

Assistant:

void Deallocate(Alloc* alloc, void* p, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  struct alignas(Alignment) M {};
  using A = typename phmap::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename phmap::allocator_traits<Alloc>::template rebind_traits<M>;
  A mem_alloc(*alloc);
  AT::deallocate(mem_alloc, static_cast<M*>(p),
                 (n + sizeof(M) - 1) / sizeof(M));
}